

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteExprList(WatWriter *this,ExprList *exprs)

{
  ExprVisitorDelegate delegate;
  ExprVisitor visitor;
  Delegate local_88;
  WatWriter *local_80;
  ExprVisitor local_78;
  
  local_88._vptr_Delegate = (_func_int **)&PTR__Delegate_00194550;
  local_80 = this;
  ExprVisitor::ExprVisitor(&local_78,&local_88);
  ExprVisitor::VisitExprList(&local_78,exprs);
  ExprVisitor::~ExprVisitor(&local_78);
  return;
}

Assistant:

void WatWriter::WriteExprList(const ExprList& exprs) {
  WABT_TRACE(WriteExprList);
  ExprVisitorDelegate delegate(this);
  ExprVisitor visitor(&delegate);
  visitor.VisitExprList(const_cast<ExprList&>(exprs));
}